

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

ostream * absl::lts_20250127::operator<<(ostream *os,Status *x)

{
  string local_38;
  Status *local_18;
  Status *x_local;
  ostream *os_local;
  
  local_18 = x;
  x_local = (Status *)os;
  Status::ToString_abi_cxx11_(&local_38,x,kWithEverything);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)x_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Status& x) {
  os << x.ToString(StatusToStringMode::kWithEverything);
  return os;
}